

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeGT_Test *this)

{
  string *this_00;
  int *in_R9;
  undefined1 local_230 [44];
  undefined4 local_204;
  AssertionResult iutest_ar;
  string local_1d8;
  wchar_t negative_sample [5];
  Fixed local_198;
  
  negative_sample[4] = L'\0';
  negative_sample[0] = L'a';
  negative_sample[1] = L'a';
  negative_sample[2] = L'a';
  negative_sample[3] = L'\xffffffff';
  local_1d8._M_dataplus._M_p._0_1_ = 0;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)local_230,(bool *)&local_1d8);
  iutest::detail::ExpressionLHS<bool>::GetResult
            ((AssertionResult *)&local_198,(ExpressionLHS<bool> *)local_230,true);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)(local_230 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)&iutest_ar,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value))))"
               ,"false","true",(char *)in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x62,(char *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,
                                      local_1d8._M_dataplus._M_p._0_1_));
    local_204 = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_230,&local_198);
    std::__cxx11::string::~string((string *)local_230);
    this_00 = &local_1d8;
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
    local_230._0_4_ = iutest::detail::wrapper::iu_wcsicmp(L"AAA",negative_sample);
    iutest::internal::CmpHelperGT<int,int>
              (&iutest_ar,(internal *)0x169a26,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", negative_sample)",(char *)&local_198
               ,(int *)local_230,in_R9);
    if (iutest_ar.m_result != false) goto LAB_0015647a;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,99,iutest_ar.m_message._M_dataplus._M_p);
    local_204 = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_230,&local_198);
    this_00 = (string *)local_230;
  }
  std::__cxx11::string::~string((string *)this_00);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_0015647a:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmpNegativeGT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(!(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", negative_sample));
}